

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O1

MPP_RET mpp_dec_start(MppDec ctx)

{
  code *pcVar1;
  uint uVar2;
  ulong uVar3;
  
  if (((byte)mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p in\n","mpp_dec_start",ctx);
  }
  uVar3 = 0;
  if ((*(undefined8 **)((long)ctx + 8) != (undefined8 *)0x0) &&
     (pcVar1 = (code *)**(undefined8 **)((long)ctx + 8), pcVar1 != (code *)0x0)) {
    uVar2 = (*pcVar1)(ctx);
    uVar3 = (ulong)uVar2;
  }
  if (((byte)mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p out ret %d\n","mpp_dec_start",ctx,uVar3);
  }
  return (MPP_RET)uVar3;
}

Assistant:

MPP_RET mpp_dec_start(MppDec ctx)
{
    MppDecImpl *dec = (MppDecImpl *)ctx;
    MPP_RET ret = MPP_OK;

    dec_dbg_func("%p in\n", dec);

    if (dec->api && dec->api->start)
        ret = dec->api->start(dec);

    dec_dbg_func("%p out ret %d\n", dec, ret);
    return ret;
}